

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

DBInfo __thiscall Clasp::Solver::reduceLinear(Solver *this,uint32 maxR,CmpScore *sc)

{
  Constraint *pCVar1;
  undefined1 auVar2 [16];
  uint32 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  DBInfo DVar14;
  ScoreType a;
  uint32 local_70;
  ConstraintScore local_6c;
  CmpScore *local_68;
  ConstraintScore local_5c;
  undefined1 local_58 [16];
  double local_48;
  ulong uStack_40;
  ConstraintScore local_34;
  
  if ((this->learnts_).ebo_.size == 0) {
    local_48 = 0.0;
    local_58 = ZEXT816(0);
  }
  else {
    lVar9 = 0;
    uVar11 = 0;
    do {
      local_5c.rep = (*(this->learnts_).ebo_.buf[uVar11]->_vptr_Constraint[0xc])();
      uVar3 = ReduceStrategy::asScore(sc->rs,&local_5c);
      lVar9 = lVar9 + (ulong)uVar3;
      uVar8 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar8;
    } while (uVar8 != (this->learnts_).ebo_.size);
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    dVar13 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_58._8_4_ = SUB84(dVar13,0);
    local_58._0_8_ = dVar13 + ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    local_58._12_4_ = (int)((ulong)dVar13 >> 0x20);
    local_48 = (double)uVar8;
  }
  local_34.rep = 0x1fffff;
  uVar3 = ReduceStrategy::asScore(sc->rs,&local_34);
  uVar8 = (this->learnts_).ebo_.size;
  if (uVar8 == 0) {
    uVar3 = 0;
    uVar11 = 0;
  }
  else {
    dVar13 = ((double)local_58._0_8_ / local_48) * 1.5;
    uVar11 = -(ulong)((double)uVar3 < dVar13);
    local_48 = (double)(~uVar11 & (ulong)dVar13 |
                       (ulong)(((double)local_58._0_8_ / (double)uVar8 + (double)uVar3) * 0.5) &
                       uVar11);
    uStack_40 = local_58._8_8_;
    uVar11 = 0;
    uVar8 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_58._8_8_;
    local_58 = auVar2 << 0x40;
    uVar10 = 0;
    local_70 = maxR;
    local_68 = sc;
    do {
      pCVar1 = (this->learnts_).ebo_.buf[uVar10];
      local_6c.rep = (*pCVar1->_vptr_Constraint[0xc])(pCVar1);
      uVar4 = (*pCVar1->_vptr_Constraint[0xb])(pCVar1,this);
      uVar3 = ReduceStrategy::asScore(local_68->rs,&local_6c);
      auVar12 = local_58;
      uVar6 = 1;
      if ((double)uVar3 <= local_48) {
        uVar5 = local_6c.rep >> 0x14 & 0x7f;
        if ((local_6c.rep & 0x7f00000) == 0) {
          uVar5 = 0x7f;
        }
        uVar6 = (uint)(uVar5 <= local_68->glue);
        if ((local_70 == 0 || (char)uVar4 != '\0') || (uVar5 <= local_68->glue)) goto LAB_0016cb77;
        if (((local_6c.rep >> 0x1b & 1) != 0) && (uVar5 <= local_68->freeze)) {
          uVar6 = 0;
          goto LAB_0016cb77;
        }
        local_70 = local_70 - 1;
        (*pCVar1->_vptr_Constraint[5])(pCVar1,this,1);
      }
      else {
LAB_0016cb77:
        iVar7 = local_58._0_4_;
        local_58._4_4_ = 0;
        local_58._0_4_ = iVar7 + uVar6;
        local_58._8_8_ = auVar12._8_8_;
        uVar8 = uVar8 + (uVar4 & 0xff);
        (this->learnts_).ebo_.buf[uVar11] = pCVar1;
        (*pCVar1->_vptr_Constraint[0xd])(pCVar1);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar4 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar4;
    } while (uVar4 != (this->learnts_).ebo_.size);
    uVar11 = uVar11 | (ulong)uVar8 << 0x20;
    uVar3 = local_58._0_4_;
  }
  DVar14.pinned = uVar3;
  DVar14.size = (int)uVar11;
  DVar14.locked = (int)(uVar11 >> 0x20);
  return DVar14;
}

Assistant:

Solver::DBInfo Solver::reduceLinear(uint32 maxR, const CmpScore& sc) {
	// compute average activity
	uint64 scoreSum = 0;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		scoreSum += sc.score(learnts_[i]->activity());
	}
	double avgAct = (scoreSum / (double) numLearntConstraints());
	// constraints with score > 1.5 times the average are "active"
	double scoreThresh = avgAct * 1.5;
	double scoreMax    = (double)sc.score(makeScore(Clasp::ACT_MAX, 1));
	if (scoreThresh > scoreMax) {
		scoreThresh = (scoreMax + (scoreSum / (double) numLearntConstraints())) / 2.0;
	}
	// remove up to maxR constraints but keep "active" and locked once
	DBInfo res = {0,0,0};
	typedef ConstraintScore ScoreType;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		Constraint* c = learnts_[i];
		ScoreType a   = c->activity();
		bool isLocked = c->locked(*this);
		bool isGlue   = sc.score(a) > scoreThresh || sc.isGlue(a);
		if (maxR == 0 || isLocked || isGlue || sc.isFrozen(a)) {
			res.pinned += isGlue;
			res.locked += isLocked;
			learnts_[res.size++] = c;
			c->decreaseActivity();
		}
		else {
			--maxR;
			c->destroy(this, true);
		}
	}
	return res;
}